

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O2

void __thiscall crnlib::dynamic_string::clear(dynamic_string *this)

{
  if (this->m_pStr != (char *)0x0) {
    crnlib_delete_array<char>(this->m_pStr);
    this->m_pStr = (char *)0x0;
    this->m_buf_size = 0;
    this->m_len = 0;
  }
  return;
}

Assistant:

void dynamic_string::clear()
    {
        check();

        if (m_pStr)
        {
            crnlib_delete_array(m_pStr);
            m_pStr = nullptr;

            m_len = 0;
            m_buf_size = 0;
        }
    }